

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-udp-pummel.c
# Opt level: O0

void timeout_cb(uv_timer_t *timer)

{
  int local_14;
  int i;
  uv_timer_t *timer_local;
  
  exiting = 1;
  for (local_14 = 0; local_14 < n_senders_; local_14 = local_14 + 1) {
    uv_close((uv_handle_t *)&senders[local_14].udp_handle,close_cb);
  }
  for (local_14 = 0; local_14 < n_receivers_; local_14 = local_14 + 1) {
    uv_close((uv_handle_t *)&receivers[local_14].udp_handle,close_cb);
  }
  return;
}

Assistant:

static void timeout_cb(uv_timer_t* timer) {
  int i;

  exiting = 1;

  for (i = 0; i < n_senders_; i++)
    uv_close((uv_handle_t*)&senders[i].udp_handle, close_cb);

  for (i = 0; i < n_receivers_; i++)
    uv_close((uv_handle_t*)&receivers[i].udp_handle, close_cb);
}